

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O1

void duckdb::ColumnArrowToDuckDBRunEndEncoded
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               uint64_t parent_offset)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this;
  ArrowArray *pAVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var5;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var6;
  ArrowRunEndEncodingState *this_00;
  PhysicalType PVar7;
  pointer this_01;
  ArrowStructInfo *this_02;
  VectorBuffer *pVVar8;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var9;
  unsigned_long capacity;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var10;
  Vector *this_03;
  type pVVar11;
  long lVar12;
  NotImplementedException *this_04;
  PhysicalType type;
  idx_t scan_offset;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_d8;
  ArrowRunEndEncodingState *local_d0;
  idx_t local_c8;
  ArrowType *local_c0;
  undefined1 local_b8 [32];
  ArrowType *local_98;
  ArrowScanLocalState *local_90;
  int64_t local_88;
  ArrowArray *local_80;
  LogicalType local_78;
  ArrowArray *local_60;
  ArrowArray *local_58;
  string local_50;
  
  local_80 = *array->children;
  pAVar1 = array->children[1];
  local_88 = nested_offset;
  this_01 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&arrow_type->type_info);
  this_02 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(this_01);
  local_c0 = ArrowStructInfo::GetChild(this_02,0);
  local_98 = ArrowStructInfo::GetChild(this_02,1);
  local_90 = array_state->state;
  peVar2 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (peVar2 != (element_type *)0x0) {
    local_b8._0_8_ =
         (vector->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8._8_8_ =
         (vector->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
      }
    }
    pVVar8 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                       ((shared_ptr<duckdb::VectorBuffer,_true> *)local_b8);
    _Var9._M_head_impl = (VectorAuxiliaryData *)operator_new(0x20);
    peVar4 = (array_state->owned_data).internal.
             super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (array_state->owned_data).internal.
             super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    (_Var9._M_head_impl)->type = ARROW_AUXILIARY;
    (_Var9._M_head_impl)->_vptr_VectorAuxiliaryData =
         (_func_int **)&PTR__ArrowAuxiliaryData_02488f68;
    _Var9._M_head_impl[1]._vptr_VectorAuxiliaryData = (_func_int **)peVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var9._M_head_impl + 1) + 8) = p_Var3;
    _Var5._M_head_impl =
         (pVVar8->aux_data).
         super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
    (pVVar8->aux_data).
    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var9._M_head_impl;
    if (_Var5._M_head_impl != (VectorAuxiliaryData *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  local_c8 = size;
  local_58 = pAVar1;
  capacity = NumericCastImpl<unsigned_long,_long,_false>::Convert(local_80->length);
  local_d0 = &array_state->run_end_encoding;
  if ((Vector *)
      (array_state->run_end_encoding).run_ends.
      super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false> == (Vector *)0x0) {
    local_60 = array;
    ArrowType::GetDuckType(&local_78,local_c0,false);
    _Var10._M_head_impl = (Vector *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)local_b8,&local_78);
    Vector::Vector(_Var10._M_head_impl,(LogicalType *)local_b8,capacity);
    local_d8._M_head_impl = _Var10._M_head_impl;
    LogicalType::~LogicalType((LogicalType *)local_b8);
    _Var10._M_head_impl = local_d8._M_head_impl;
    local_d8._M_head_impl = (Vector *)0x0;
    __ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (local_d0->run_ends).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
         ._M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>;
    (local_d0->run_ends).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t
    .super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false> =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)_Var10._M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)local_d0,
                 (Vector *)__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
    if (local_d8._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_d8,local_d8._M_head_impl);
    }
    local_d8._M_head_impl = (Vector *)0x0;
    LogicalType::~LogicalType(&local_78);
    ArrowType::GetDuckType(&local_78,local_98,false);
    this_03 = (Vector *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)local_b8,&local_78);
    Vector::Vector(this_03,(LogicalType *)local_b8,capacity);
    local_d8._M_head_impl = this_03;
    LogicalType::~LogicalType((LogicalType *)local_b8);
    this_00 = local_d0;
    _Var6._M_head_impl = local_d8._M_head_impl;
    this = &(array_state->run_end_encoding).values;
    local_d8._M_head_impl = (Vector *)0x0;
    _Var10._M_head_impl =
         (array_state->run_end_encoding).values.
         super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    (array_state->run_end_encoding).values.
    super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var10._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)this,_Var10._M_head_impl);
    }
    if (local_d8._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_d8,local_d8._M_head_impl);
    }
    local_d8._M_head_impl = (Vector *)0x0;
    LogicalType::~LogicalType(&local_78);
    pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&this_00->run_ends);
    ColumnArrowToDuckDB(pVVar11,local_80,array_state,capacity,local_c0,-1,(ValidityMask *)0x0,0,
                        false);
    pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this)
    ;
    lVar12 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)parent_mask);
    FlatVector::VerifyFlatVector(pVVar11);
    pAVar1 = local_58;
    GetValidityMask(&pVVar11->validity,local_58,local_90,capacity,lVar12,local_88,false);
    ColumnArrowToDuckDB(pVVar11,pAVar1,array_state,capacity,local_98,-1,(ValidityMask *)0x0,0,false)
    ;
    array = local_60;
  }
  lVar12 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)parent_mask);
  if (local_88 == -1) {
    scan_offset = array->offset + lVar12 + local_90->chunk_offset;
  }
  else {
    scan_offset = local_88 + array->offset;
  }
  ArrowType::GetDuckType((LogicalType *)local_b8,local_c0,false);
  PVar7 = local_b8[1];
  LogicalType::~LogicalType((LogicalType *)local_b8);
  if ((PVar7 == INT64) || (PVar7 == INT32)) {
    FlattenRunEndsSwitch<int>(vector,local_d0,capacity,scan_offset,local_c8);
  }
  else {
    if (PVar7 != INT16) {
      this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Type \'%s\' not implemented for RunEndEncoding","");
      TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)PVar7,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_04,(string *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    FlattenRunEndsSwitch<short>(vector,local_d0,capacity,scan_offset,local_c8);
  }
  return;
}

Assistant:

static void ColumnArrowToDuckDBRunEndEncoded(Vector &vector, const ArrowArray &array, ArrowArrayScanState &array_state,
                                             idx_t size, const ArrowType &arrow_type, int64_t nested_offset,
                                             ValidityMask *parent_mask, uint64_t parent_offset) {
	// Scan the 'run_ends' array
	D_ASSERT(array.n_children == 2);
	auto &run_ends_array = *array.children[0];
	auto &values_array = *array.children[1];

	auto &struct_info = arrow_type.GetTypeInfo<ArrowStructInfo>();
	auto &run_ends_type = struct_info.GetChild(0);
	auto &values_type = struct_info.GetChild(1);
	D_ASSERT(vector.GetType() == values_type.GetDuckType());

	auto &scan_state = array_state.state;
	if (vector.GetBuffer()) {
		vector.GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(array_state.owned_data));
	}

	D_ASSERT(run_ends_array.length == values_array.length);
	auto compressed_size = NumericCast<idx_t>(run_ends_array.length);
	// Create a vector for the run ends and the values
	auto &run_end_encoding = array_state.RunEndEncoding();
	if (!run_end_encoding.run_ends) {
		// The run ends and values have not been scanned yet for this array
		D_ASSERT(!run_end_encoding.values);
		run_end_encoding.run_ends = make_uniq<Vector>(run_ends_type.GetDuckType(), compressed_size);
		run_end_encoding.values = make_uniq<Vector>(values_type.GetDuckType(), compressed_size);

		ColumnArrowToDuckDB(*run_end_encoding.run_ends, run_ends_array, array_state, compressed_size, run_ends_type);
		auto &values = *run_end_encoding.values;
		SetValidityMask(values, values_array, scan_state, compressed_size, NumericCast<int64_t>(parent_offset),
		                nested_offset);
		ColumnArrowToDuckDB(values, values_array, array_state, compressed_size, values_type);
	}

	idx_t scan_offset = GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset), scan_state, nested_offset);
	auto physical_type = run_ends_type.GetDuckType().InternalType();
	switch (physical_type) {
	case PhysicalType::INT16:
		FlattenRunEndsSwitch<int16_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT32:
		FlattenRunEndsSwitch<int32_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT64:
		FlattenRunEndsSwitch<int32_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	default:
		throw NotImplementedException("Type '%s' not implemented for RunEndEncoding", TypeIdToString(physical_type));
	}
}